

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_public.c
# Opt level: O1

void nng_http_del_header(nng_http *conn,char *key)

{
  nni_http_del_header(conn,key);
  return;
}

Assistant:

void
nng_http_del_header(nng_http *conn, const char *key)
{
#ifdef NNG_SUPP_HTTP
	nni_http_del_header(conn, key);
#else
	NNI_ARG_UNUSED(conn);
	NNI_ARG_UNUSED(key);
#endif
}